

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.cpp
# Opt level: O3

int __thiscall Catch::Session::runInternal(Session *this)

{
  ColourMode CVar1;
  Config *pCVar2;
  undefined8 *puVar3;
  long *plVar4;
  long *plVar5;
  unique_ptr<Catch::MultiReporter> uVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar10;
  undefined4 extraout_var;
  undefined8 *puVar11;
  ostream *poVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined1 *puVar13;
  _Rb_tree_color _Var14;
  char *pcVar15;
  TestCaseInfo **testInfo;
  long *plVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__x;
  pointer pPVar18;
  unique_ptr<Catch::MultiReporter> multi;
  IEventListenerPtr reporter;
  Totals totals;
  TestGroup tests;
  unique_ptr<Catch::MultiReporter> local_2c8;
  undefined1 local_2c0 [8];
  MultiReporter *local_2b8;
  undefined1 local_2b0 [8];
  undefined1 local_2a8 [8];
  undefined1 local_2a0 [72];
  undefined1 local_258 [32];
  AssertionResult local_238 [3];
  bool local_38;
  
  if (this->m_startupExceptions != false) {
    return 1;
  }
  if ((this->m_configData).showHelp != false) {
    return 0;
  }
  if ((this->m_configData).libIdentify != false) {
    return 0;
  }
  if ((this->m_configData).shardCount <= (this->m_configData).shardIndex) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"The shard count (",0x11);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar12,") must be greater than the shard index (",0x28);
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    std::__ostream_insert<char,std::char_traits<char>>(poVar12,")\n",2);
    std::ostream::flush();
    return 1;
  }
  config(this);
  pCVar2 = (this->m_config).m_ptr;
  if (pCVar2 == (Config *)0x0) {
LAB_0012590e:
    pcVar15 = "T &Catch::Detail::unique_ptr<Catch::Config>::operator*() [T = Catch::Config]";
LAB_00125951:
    __assert_fail("m_ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.hpp"
                  ,0x37d,pcVar15);
  }
  sharedRng();
  uVar8 = (*(pCVar2->super_IConfig)._vptr_IConfig[0x11])(pCVar2);
  sharedRng::s_rng.m_state = (ulong)uVar8 * 0x5851f42d4c957f2d + 0x6f1903917447ed96;
  if ((this->m_configData).filenamesAsTags == true) {
    pSVar10 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar9 = (*(pSVar10->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar10);
    puVar11 = (undefined8 *)
              (**(code **)(*(long *)CONCAT44(extraout_var,iVar9) + 0x10))
                        ((long *)CONCAT44(extraout_var,iVar9));
    puVar3 = (undefined8 *)puVar11[1];
    for (puVar11 = (undefined8 *)*puVar11; puVar11 != puVar3; puVar11 = puVar11 + 1) {
      TestCaseInfo::addFilenameTag((TestCaseInfo *)*puVar11);
    }
  }
  if (Context::currentContext == (long *)0x0) {
    Context::currentContext = (long *)operator_new(0x10);
    *Context::currentContext = 0;
    Context::currentContext[1] = 0;
  }
  pCVar2 = (this->m_config).m_ptr;
  *Context::currentContext = (long)pCVar2;
  pSVar10 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
            ::getInternal();
  iVar9 = (*(pSVar10->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar10);
  plVar4 = *(long **)CONCAT44(extraout_var_00,iVar9);
  if (plVar4 == (long *)0x0) {
LAB_001258f7:
    pcVar15 = 
    "const T *Catch::Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->() const [T = Catch::ReporterRegistry::ReporterRegistryImpl]"
    ;
LAB_001258ed:
    __assert_fail("m_ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.hpp"
                  ,0x389,pcVar15);
  }
  if ((*plVar4 == plVar4[1]) &&
     (pPVar18 = (pCVar2->m_processedReporterSpecs).
                super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>
                ._M_impl.super__Vector_impl_data._M_start,
     (long)(pCVar2->m_processedReporterSpecs).
           super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>
           ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar18 == 0x78)) {
    makeStream((Catch *)&local_2c8,(string *)&pPVar18->outputFilename);
    CVar1 = pPVar18->colourMode;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_2a8,&(pPVar18->customOptions)._M_t);
    local_238[0].m_info.lineInfo.file = local_258 + 0x20;
    local_258._0_8_ = local_2c8.m_ptr;
    if ((_Base_ptr)local_2a0._8_8_ == (_Base_ptr)0x0) {
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_258 + 0x40);
      local_238[0].m_info.macroName.m_size = 0;
      _Var14 = _S_red;
      local_238[0].m_info.lineInfo.line = (size_t)local_238[0].m_info.lineInfo.file;
    }
    else {
      local_238[0].m_info.macroName.m_size = local_2a0._8_8_;
      *(char **)(local_2a0._8_8_ + 8) = local_238[0].m_info.lineInfo.file;
      paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_2a0 + 0x20);
      local_238[0].m_info.capturedExpression.m_start = (char *)local_2a0._32_8_;
      local_2a0._8_8_ = (_Base_ptr)0x0;
      local_238[0].m_info.lineInfo.file = (char *)local_2a0._16_8_;
      local_238[0].m_info.lineInfo.line = local_2a0._24_8_;
      _Var14 = local_2a0._0_4_;
      local_2a0._16_8_ = (AssertionResult *)(local_2a8 + 8);
      local_2a0._24_8_ = (AssertionResult *)(local_2a8 + 8);
    }
    local_258._8_8_ = pCVar2;
    local_258[0x10] = CVar1;
    paVar17->_M_allocated_capacity = 0;
    local_238[0].m_info.macroName.m_start._0_4_ = _Var14;
    anon_unknown_26::createReporter((string *)local_2c0,(ReporterConfig *)pPVar18);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)(local_258 + 0x18));
    if ((MultiReporter *)local_258._0_8_ != (MultiReporter *)0x0) {
      (*((IEventListener *)local_258._0_8_)->_vptr_IEventListener[1])();
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_2a8);
  }
  else {
    local_2c8.m_ptr = (MultiReporter *)operator_new(0x40);
    ((local_2c8.m_ptr)->super_IEventListener).m_preferences.shouldRedirectStdOut = false;
    ((local_2c8.m_ptr)->super_IEventListener).m_preferences.shouldReportAllAssertions = false;
    ((local_2c8.m_ptr)->super_IEventListener).m_config = &pCVar2->super_IConfig;
    ((local_2c8.m_ptr)->super_IEventListener)._vptr_IEventListener =
         (_func_int **)&PTR__MultiReporter_00242e20;
    (local_2c8.m_ptr)->m_insertedListeners = 0;
    ((local_2c8.m_ptr)->m_reporterLikes).
    super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ((local_2c8.m_ptr)->m_reporterLikes).
    super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    *(undefined8 *)
     ((long)&((local_2c8.m_ptr)->m_reporterLikes).
             super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
    *(undefined8 *)
     ((long)&((local_2c8.m_ptr)->m_reporterLikes).
             super__Vector_base<Catch::Detail::unique_ptr<Catch::IEventListener>,_std::allocator<Catch::Detail::unique_ptr<Catch::IEventListener>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
    pSVar10 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
              ::getInternal();
    iVar9 = (*(pSVar10->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar10);
    plVar4 = *(long **)CONCAT44(extraout_var_01,iVar9);
    if (plVar4 == (long *)0x0) goto LAB_001258f7;
    plVar16 = (long *)*plVar4;
    plVar4 = (long *)plVar4[1];
    local_2a0._56_8_ = this;
    if (plVar16 != plVar4) {
      do {
        uVar6.m_ptr = local_2c8.m_ptr;
        if (local_2c8.m_ptr == (MultiReporter *)0x0) goto LAB_001258a2;
        plVar5 = (long *)*plVar16;
        if (plVar5 == (long *)0x0) {
          pcVar15 = 
          "const T *Catch::Detail::unique_ptr<Catch::EventListenerFactory>::operator->() const [T = Catch::EventListenerFactory]"
          ;
          goto LAB_001258ed;
        }
        (**(code **)(*plVar5 + 0x10))((IEventListenerPtr *)local_258,plVar5,pCVar2);
        MultiReporter::addListener(uVar6.m_ptr,(IEventListenerPtr *)local_258);
        if ((MultiReporter *)local_258._0_8_ != (MultiReporter *)0x0) {
          (*((IEventListener *)local_258._0_8_)->_vptr_IEventListener[1])();
        }
        plVar16 = plVar16 + 1;
      } while (plVar16 != plVar4);
    }
    pPVar18 = (pCVar2->m_processedReporterSpecs).
              super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_2a0._64_8_ =
         (pCVar2->m_processedReporterSpecs).
         super__Vector_base<Catch::ProcessedReporterSpec,_std::allocator<Catch::ProcessedReporterSpec>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (pPVar18 != (pointer)local_2a0._64_8_) {
      __x = &pPVar18->customOptions;
      do {
        uVar6.m_ptr = local_2c8.m_ptr;
        if (local_2c8.m_ptr == (MultiReporter *)0x0) goto LAB_001258a2;
        makeStream((Catch *)&local_2b8,(string *)((long)(__x + -1) + 8));
        CVar1 = *(ColourMode *)((long)(__x + -1) + 0x28);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_2a8,&__x->_M_t);
        local_258._0_8_ = local_2b8;
        local_2b8 = (MultiReporter *)0x0;
        if ((_Base_ptr)local_2a0._8_8_ == (_Base_ptr)0x0) {
          local_238[0].m_info.macroName.m_size = 0;
          _Var14 = _S_red;
          local_238[0].m_info.lineInfo.file = local_258 + 0x20;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_258 + 0x40);
          local_238[0].m_info.lineInfo.line = (size_t)local_238[0].m_info.lineInfo.file;
        }
        else {
          local_238[0].m_info.macroName.m_size = local_2a0._8_8_;
          *(_Base_ptr *)(local_2a0._8_8_ + 8) = (_Base_ptr)(local_258 + 0x20);
          local_238[0].m_info.capturedExpression.m_start = (char *)local_2a0._32_8_;
          local_2a0._8_8_ = (_Base_ptr)0x0;
          paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_2a0 + 0x20);
          local_238[0].m_info.lineInfo.file = (char *)local_2a0._16_8_;
          local_238[0].m_info.lineInfo.line = local_2a0._24_8_;
          _Var14 = local_2a0._0_4_;
          local_2a0._16_8_ = (AssertionResult *)(local_2a8 + 8);
          local_2a0._24_8_ = (AssertionResult *)(local_2a8 + 8);
        }
        local_258._8_8_ = pCVar2;
        local_258[0x10] = CVar1;
        paVar17->_M_allocated_capacity = 0;
        local_238[0].m_info.macroName.m_start._0_4_ = _Var14;
        anon_unknown_26::createReporter
                  ((string *)local_2b0,(ReporterConfig *)((long)(__x + -2) + 0x18));
        MultiReporter::addReporter(uVar6.m_ptr,(IEventListenerPtr *)local_2b0);
        if (local_2b0 != (undefined1  [8])0x0) {
          (**(code **)(*(long *)local_2b0 + 8))();
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)(local_258 + 0x18));
        if ((MultiReporter *)local_258._0_8_ != (MultiReporter *)0x0) {
          (*((IEventListener *)local_258._0_8_)->_vptr_IEventListener[1])();
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_2a8);
        pPVar18 = (pointer)(__x + 1);
        __x = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)(__x + 2) + 0x18);
      } while (pPVar18 != (pointer)local_2a0._64_8_);
    }
    local_2c0 = (undefined1  [8])local_2c8.m_ptr;
    local_2c8.m_ptr = (MultiReporter *)0x0;
    Detail::unique_ptr<Catch::MultiReporter>::~unique_ptr(&local_2c8);
    this = (Session *)local_2a0._56_8_;
  }
  pCVar2 = (this->m_config).m_ptr;
  if (pCVar2 == (Config *)0x0) {
LAB_00125925:
    pcVar15 = "T *Catch::Detail::unique_ptr<Catch::Config>::operator->() [T = Catch::Config]";
LAB_001258ce:
    __assert_fail("m_ptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/jbaldwin[P]libcappuccino/test/catch.hpp"
                  ,0x385,pcVar15);
  }
  iVar9 = (*(pCVar2->super_IConfig)._vptr_IConfig[0xd])();
  puVar11 = *(undefined8 **)(CONCAT44(extraout_var_02,iVar9) + 0x18);
  puVar3 = *(undefined8 **)(CONCAT44(extraout_var_02,iVar9) + 0x20);
  if (puVar11 != puVar3) {
    do {
      if (local_2c0 == (undefined1  [8])0x0) {
        pcVar15 = 
        "T *Catch::Detail::unique_ptr<Catch::IEventListener>::operator->() [T = Catch::IEventListener]"
        ;
        goto LAB_001258ce;
      }
      (**(code **)(*(long *)local_2c0 + 0x18))(local_2c0,*puVar11,puVar11[1]);
      puVar11 = puVar11 + 4;
    } while (puVar11 != puVar3);
    _Var14 = _S_black;
    goto LAB_00125817;
  }
  if (local_2c0 == (undefined1  [8])0x0) {
    pcVar15 = 
    "T &Catch::Detail::unique_ptr<Catch::IEventListener>::operator*() [T = Catch::IEventListener]";
    goto LAB_00125951;
  }
  pCVar2 = (this->m_config).m_ptr;
  if (pCVar2 == (Config *)0x0) goto LAB_0012590e;
  bVar7 = list((IEventListener *)local_2c0,pCVar2);
  _Var14 = _S_red;
  if (bVar7) goto LAB_00125817;
  anon_unknown_26::TestGroup::TestGroup
            ((TestGroup *)local_258,(IEventListenerPtr *)local_2c0,(this->m_config).m_ptr);
  anon_unknown_26::TestGroup::execute((Totals *)local_2a8,(TestGroup *)local_258);
  if (local_38 == true) {
    pCVar2 = (this->m_config).m_ptr;
    if (pCVar2 == (Config *)0x0) goto LAB_00125925;
    iVar9 = (*(pCVar2->super_IConfig)._vptr_IConfig[7])();
    _Var14 = 3;
    if ((char)iVar9 == '\0') goto LAB_00125784;
  }
  else {
LAB_00125784:
    puVar13 = (undefined1 *)
              ((long)&(((AssertionInfo *)local_2a0._24_8_)->macroName).m_start + local_2a0._32_8_);
    if (puVar13 + local_2a0._48_8_ + local_2a0._40_8_ == (undefined1 *)0x0) {
      pCVar2 = (this->m_config).m_ptr;
      if (pCVar2 == (Config *)0x0) goto LAB_00125925;
      iVar9 = (*(pCVar2->super_IConfig)._vptr_IConfig[8])();
      _Var14 = 2;
      if ((char)iVar9 == '\0') goto LAB_0012580d;
      puVar13 = (undefined1 *)
                ((long)&(((AssertionInfo *)local_2a0._24_8_)->macroName).m_start + local_2a0._32_8_)
      ;
    }
    if ((puVar13 + local_2a0._40_8_ == (undefined1 *)0x0) && (local_2a0._48_8_ != 0)) {
      pCVar2 = (this->m_config).m_ptr;
      if (pCVar2 == (Config *)0x0) goto LAB_00125925;
      iVar9 = (*(pCVar2->super_IConfig)._vptr_IConfig[8])();
      _Var14 = 4;
      if ((char)iVar9 == '\0') goto LAB_0012580d;
    }
    _Var14 = 0xff;
    if ((int)local_2a0._0_4_ < 0xff) {
      _Var14 = local_2a0._0_4_;
    }
  }
LAB_0012580d:
  anon_unknown_26::TestGroup::~TestGroup((TestGroup *)local_258);
LAB_00125817:
  if (local_2c0 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_2c0 + 8))();
  }
  return _Var14;
LAB_001258a2:
  pcVar15 = 
  "T *Catch::Detail::unique_ptr<Catch::MultiReporter>::operator->() [T = Catch::MultiReporter]";
  goto LAB_001258ce;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        if ( m_configData.shardIndex >= m_configData.shardCount ) {
            Catch::cerr() << "The shard count (" << m_configData.shardCount
                          << ") must be greater than the shard index ("
                          << m_configData.shardIndex << ")\n"
                          << std::flush;
            return 1;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if (m_configData.filenamesAsTags) {
                applyFilenamesAsTags();
            }

            // Set up global config instance before we start calling into other functions
            getCurrentMutableContext().setConfig(m_config.get());

            // Create reporter(s) so we can route listings through them
            auto reporter = prepareReporters(m_config.get());

            auto const& invalidSpecs = m_config->testSpec().getInvalidSpecs();
            if ( !invalidSpecs.empty() ) {
                for ( auto const& spec : invalidSpecs ) {
                    reporter->reportInvalidTestSpec( spec );
                }
                return 1;
            }


            // Handle list request
            if (list(*reporter, *m_config)) {
                return 0;
            }

            TestGroup tests { CATCH_MOVE(reporter), m_config.get() };
            auto const totals = tests.execute();

            if ( tests.hadUnmatchedTestSpecs()
                && m_config->warnAboutUnmatchedTestSpecs() ) {
                return 3;
            }

            if ( totals.testCases.total() == 0
                && !m_config->zeroTestsCountAsSuccess() ) {
                return 2;
            }

            if ( totals.testCases.total() > 0 &&
                 totals.testCases.total() == totals.testCases.skipped
                && !m_config->zeroTestsCountAsSuccess() ) {
                return 4;
            }

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, static_cast<int>(totals.assertions.failed));
        }